

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

Gia_Man_t * Gia_ManOrigIdsReduceTest(Gia_Man_t *p,Vec_Int_t *vPairs)

{
  Gia_Man_t *p_00;
  Gia_Man_t *pGVar1;
  Gia_Man_t *pNew;
  Gia_Man_t *pTemp;
  Vec_Int_t *vPairs_local;
  Gia_Man_t *p_local;
  
  p_00 = Gia_ManOrigIdsReduce(p,vPairs);
  Gia_ManPrintStats(p,(Gps_Par_t *)0x0);
  Gia_ManPrintStats(p_00,(Gps_Par_t *)0x0);
  pGVar1 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar1;
}

Assistant:

Gia_Man_t * Gia_ManOrigIdsReduceTest( Gia_Man_t * p, Vec_Int_t * vPairs )
{
    Gia_Man_t * pTemp, * pNew = Gia_ManOrigIdsReduce( p, vPairs );
    Gia_ManPrintStats( p, NULL );
    Gia_ManPrintStats( pNew, NULL );
    //Gia_ManStop( pNew );
    // cleanup the resulting one
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}